

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_fcall(runtime_type *this,var *a,token_base *b)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  int iVar2;
  token_base **pptVar3;
  callable *this_00;
  runtime_error *this_01;
  token_arglist *in_RCX;
  proxy *in_RDI;
  any *it_1;
  const_iterator __end5;
  const_iterator __begin5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr_1;
  var val_1;
  tree_type<cs::token_base_*> *tree_1;
  iterator __end3;
  iterator __begin3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3;
  token_base *ptr_1;
  vector args_1;
  object_method *om;
  any *it;
  const_iterator __end4;
  const_iterator __begin4;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range4;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr;
  var val;
  tree_type<cs::token_base_*> *tree;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  token_base *ptr;
  vector args;
  undefined1 in_stack_000005df;
  iterator *in_stack_000005e0;
  runtime_type *in_stack_000005e8;
  _Self *in_stack_fffffffffffffc98;
  _Self *in_stack_fffffffffffffca0;
  callable *in_stack_fffffffffffffca8;
  allocator *paVar4;
  type_info *in_stack_fffffffffffffcb0;
  allocator_type *in_stack_fffffffffffffcc8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffcd0;
  iterator in_stack_fffffffffffffcd8;
  iterator *in_stack_fffffffffffffce0;
  undefined8 **local_2e8;
  any *in_stack_fffffffffffffd20;
  any *this_02;
  allocator local_281;
  string local_280 [32];
  tree_node *local_260;
  reference local_240;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_218;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_1f8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_1f0;
  tree_node *local_1e8;
  tree_node *local_1d8;
  reference local_1d0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_1a8;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_188;
  token_expand *local_180;
  undefined1 local_171 [9];
  undefined8 *local_168;
  undefined1 **local_160;
  undefined8 local_158;
  object_method *local_138;
  tree_node *local_130;
  reference local_110;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_e8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_c8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_c0;
  tree_node *local_b8;
  tree_node *local_a8;
  reference local_a0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_78;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_58;
  token_expand *local_40;
  token_arglist *local_20;
  
  local_20 = in_RCX;
  cs_impl::any::type((any *)in_stack_fffffffffffffca0);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffcb0,(type_info *)in_stack_fffffffffffffca8);
  if (bVar1) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x1cddb4);
    local_40 = (token_expand *)0x0;
    token_arglist::get_arglist(local_20);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          *)0x1cddd5);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
              (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
    local_58 = token_arglist::get_arglist(local_20);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffffc98);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffc98);
    while( true ) {
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffca0,(_Self *)in_stack_fffffffffffffc98)
      ;
      if (!bVar1) break;
      local_a0 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator*(&local_78);
      local_a8 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
      pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffce0);
      local_40 = (token_expand *)*pptVar3;
      if (local_40 == (token_expand *)0x0) {
LAB_001ce074:
        local_130 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
        parse_expr(in_stack_000005e8,in_stack_000005e0,(bool)in_stack_000005df);
        lvalue((var *)in_stack_fffffffffffffca8);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffca0,
                   (value_type *)in_stack_fffffffffffffc98);
        cs_impl::any::~any((any *)0x1ce0f7);
        cs_impl::any::~any((any *)0x1ce104);
      }
      else {
        iVar2 = (*(local_40->super_token_base)._vptr_token_base[2])();
        if (iVar2 != 6) goto LAB_001ce074;
        token_expand::get_tree(local_40);
        local_b8 = (tree_node *)
                   tree_type<cs::token_base_*>::root
                             ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
        parse_expr(in_stack_000005e8,in_stack_000005e0,(bool)in_stack_000005df);
        local_c8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                             (in_stack_fffffffffffffd20);
        local_c0 = local_c8;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffc98);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffc98);
        while( true ) {
          bVar1 = std::operator!=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          if (!bVar1) break;
          local_110 = std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                      ::operator*(&local_e8);
          lvalue((var *)in_stack_fffffffffffffca8);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     in_stack_fffffffffffffca0,(value_type *)in_stack_fffffffffffffc98);
          cs_impl::any::~any((any *)0x1cdfef);
          std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                    (in_stack_fffffffffffffca0);
        }
        cs_impl::any::~any((any *)0x1ce05d);
      }
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffffca0);
    }
    cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffd20);
    callable::call(in_stack_fffffffffffffca8,(vector *)in_stack_fffffffffffffca0);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffcb0);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffca0);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffcb0,(type_info *)in_stack_fffffffffffffca8);
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar4 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"Unsupported operator operations(Fcall).",paVar4);
      runtime_error::runtime_error(this_01,(string *)in_stack_fffffffffffffc98);
      __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_138 = cs_impl::any::const_val<cs::object_method>(in_stack_fffffffffffffd20);
    local_171._1_8_ = &local_168;
    cs_impl::any::any((any *)in_stack_fffffffffffffca0,(any *)in_stack_fffffffffffffc98);
    local_160 = (undefined1 **)&local_168;
    local_158 = 1;
    this_02 = (any *)local_171;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x1ce244);
    __l._M_len = (size_type)in_stack_fffffffffffffce0;
    __l._M_array = in_stack_fffffffffffffcd8;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffcd0,__l,in_stack_fffffffffffffcc8);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x1ce278);
    local_2e8 = &local_160;
    do {
      local_2e8 = local_2e8 + -1;
      cs_impl::any::~any((any *)0x1ce2a7);
    } while (local_2e8 != &local_168);
    local_180 = (token_expand *)0x0;
    token_arglist::get_arglist(local_20);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          *)0x1ce2df);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
              (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
    local_188 = token_arglist::get_arglist(local_20);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffffc98);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffc98);
    while( true ) {
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffca0,(_Self *)in_stack_fffffffffffffc98)
      ;
      if (!bVar1) break;
      local_1d0 = std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator*(&local_1a8);
      local_1d8 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
      pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffce0);
      local_180 = (token_expand *)*pptVar3;
      if (local_180 == (token_expand *)0x0) {
LAB_001ce626:
        local_260 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
        parse_expr(in_stack_000005e8,in_stack_000005e0,(bool)in_stack_000005df);
        lvalue((var *)in_stack_fffffffffffffca8);
        std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffca0,
                   (value_type *)in_stack_fffffffffffffc98);
        cs_impl::any::~any((any *)0x1ce6a3);
        cs_impl::any::~any((any *)0x1ce6b0);
      }
      else {
        iVar2 = (*(local_180->super_token_base)._vptr_token_base[2])();
        if (iVar2 != 6) goto LAB_001ce626;
        token_expand::get_tree(local_180);
        local_1e8 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc98);
        parse_expr(in_stack_000005e8,in_stack_000005e0,(bool)in_stack_000005df);
        local_1f8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                              (this_02);
        local_1f0 = local_1f8;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffc98);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffc98);
        while( true ) {
          bVar1 = std::operator!=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          if (!bVar1) break;
          local_240 = std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                      ::operator*(&local_218);
          lvalue((var *)in_stack_fffffffffffffca8);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     in_stack_fffffffffffffca0,(value_type *)in_stack_fffffffffffffc98);
          cs_impl::any::~any((any *)0x1ce4e1);
          std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                    (in_stack_fffffffffffffca0);
        }
        cs_impl::any::~any((any *)0x1ce60f);
      }
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffffca0);
    }
    this_00 = cs_impl::any::const_val<cs::callable>(this_02);
    callable::call(in_stack_fffffffffffffca8,(vector *)in_stack_fffffffffffffca0);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)this_00);
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_fcall(const var &a, token_base *b)
	{
		if (a.type() == typeid(callable)) {
			vector args;
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return a.const_val<callable>().call(args);
		}
		else if (a.type() == typeid(object_method)) {
			const auto &om = a.const_val<object_method>();
			vector args{om.object};
			token_base *ptr = nullptr;
			args.reserve(static_cast<token_arglist *>(b)->get_arglist().size());
			for (auto &tree: static_cast<token_arglist *>(b)->get_arglist()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &arr = val.const_val<array>();
					for (auto &it: arr)
						args.push_back(lvalue(it));
				}
				else
					args.push_back(lvalue(parse_expr(tree.root())));
			}
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Unsupported operator operations(Fcall).");
	}